

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_NetworkAdapter.cpp
# Opt level: O2

size_t axl::io::getMacAddressString(String *string,uchar_t *macAddress,uint_t flags)

{
  char *pcVar1;
  char *formatString;
  size_t sVar2;
  bool bVar3;
  
  bVar3 = (flags & 1) == 0;
  pcVar1 = "%08X-%04X-%04X-%02X%02X-%02X%02X%02X%02X%02X%02X";
  if (bVar3) {
    pcVar1 = "%08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x";
  }
  formatString = "%02X:%02X:%02X:%02X:%02X:%02X";
  if (bVar3) {
    formatString = "%02x:%02x:%02x:%02x:%02x:%02x";
  }
  if ((flags & 2) != 0) {
    formatString = pcVar1 + 0x18;
  }
  sVar2 = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::format
                    (string,formatString,(ulong)*macAddress,(ulong)macAddress[1],
                     (ulong)macAddress[2],(ulong)macAddress[3],(ulong)macAddress[4],
                     (ulong)macAddress[5]);
  return sVar2;
}

Assistant:

size_t
getMacAddressString(
	sl::String* string,
	const uchar_t* macAddress,
	uint_t flags
) {
	return string->format(
		(flags & enc::HexEncodingFlag_NoSpace) ?
			(flags & enc::HexEncodingFlag_UpperCase) ?
				"%02X%02X%02X%02X%02X%02X" :
				"%02x%02x%02x%02x%02x%02x" :
			(flags & enc::HexEncodingFlag_UpperCase) ?
				"%02X:%02X:%02X:%02X:%02X:%02X" :
				"%02x:%02x:%02x:%02x:%02x:%02x",
		macAddress[0],
		macAddress[1],
		macAddress[2],
		macAddress[3],
		macAddress[4],
		macAddress[5]
	);
}